

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManPoIsToRemove(Gia_Man_t *p,Gia_Obj_t *pObj,int Value)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool local_25;
  int Value_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCo(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x854,"int Gia_ManPoIsToRemove(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  if (Value == -1) {
    pGVar2 = Gia_ObjFanin0(pObj);
    p_local._4_4_ = Gia_ObjIsConst0(pGVar2);
  }
  else {
    if ((Value != 0) && (Value != 1)) {
      __assert_fail("Value == 0 || Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                    ,0x857,"int Gia_ManPoIsToRemove(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjIsConst0(pGVar2);
    local_25 = false;
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninC0(pObj);
      local_25 = Value == iVar1;
    }
    p_local._4_4_ = (uint)local_25;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManPoIsToRemove( Gia_Man_t * p, Gia_Obj_t * pObj, int Value )
{
    assert( Gia_ObjIsCo(pObj) );
    if ( Value == -1 )
        return Gia_ObjIsConst0(Gia_ObjFanin0(pObj));
    assert( Value == 0 || Value == 1 );
    return Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && Value == Gia_ObjFaninC0(pObj);
}